

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar6 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar7 = vpsadbw_avx2(auVar6,*(undefined1 (*) [32])above);
  auVar2 = vpermq_avx2(auVar7,0x4e);
  auVar2 = vpaddq_avx2(auVar2,auVar7);
  auVar1 = vpshufd_avx2(auVar2,0xee);
  auVar7 = vpsadbw_avx2(auVar6,*(undefined1 (*) [32])left);
  auVar3 = vpermq_avx2(auVar7,0x4e);
  auVar3 = vpaddq_avx2(auVar3,auVar7);
  auVar8._8_2_ = 0x20;
  auVar8._0_8_ = 0x20002000200020;
  auVar8._10_2_ = 0x20;
  auVar8._12_2_ = 0x20;
  auVar8._14_2_ = 0x20;
  auVar8._16_2_ = 0x20;
  auVar8._18_2_ = 0x20;
  auVar8._20_2_ = 0x20;
  auVar8._22_2_ = 0x20;
  auVar8._24_2_ = 0x20;
  auVar8._26_2_ = 0x20;
  auVar8._28_2_ = 0x20;
  auVar8._30_2_ = 0x20;
  auVar7 = vpshufd_avx2(auVar3,0xee);
  auVar7 = vpaddw_avx2(auVar7,auVar8);
  auVar2 = vpaddw_avx2(auVar2,auVar3);
  auVar2 = vpaddw_avx2(auVar2,auVar1);
  auVar7 = vpaddw_avx2(auVar2,auVar7);
  auVar7 = vpsrlw_avx2(auVar7,6);
  auVar7 = vpshufb_avx2(auVar7,auVar6);
  iVar4 = 0x20;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    *(undefined1 (*) [32])dst = auVar7;
    dst = *(undefined1 (*) [32])dst + stride;
  }
  return;
}

Assistant:

static inline __m256i dc_sum_32(const uint8_t *ref) {
  const __m256i x = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i zero = _mm256_setzero_si256();
  __m256i y = _mm256_sad_epu8(x, zero);
  __m256i u = _mm256_permute2x128_si256(y, y, 1);
  y = _mm256_add_epi64(u, y);
  u = _mm256_unpackhi_epi64(y, y);
  return _mm256_add_epi16(y, u);
}